

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mult.hpp
# Opt level: O2

double calc_mean_only_weighted<float,long,std::vector<double,std::allocator<double>>,double>
                 (size_t *ix_arr,size_t st,size_t end,size_t col_num,float *Xc,long *Xc_ind,
                 long *Xc_indptr,vector<double,_std::allocator<double>_> *w)

{
  ulong *puVar1;
  ulong *puVar2;
  ulong *puVar3;
  double dVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  unsigned_long *puVar8;
  long *plVar9;
  long lVar10;
  size_t row;
  double dVar11;
  double dVar12;
  double local_78;
  
  lVar10 = Xc_indptr[col_num];
  lVar5 = Xc_indptr[col_num + 1];
  if (lVar10 == lVar5) {
    return 0.0;
  }
  puVar2 = (ulong *)(Xc_ind + lVar5 + -1);
  uVar6 = *puVar2;
  puVar3 = ix_arr + end + 1;
  puVar8 = std::__lower_bound<unsigned_long*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                     (ix_arr + st,puVar3);
  dVar11 = 0.0;
  for (; st <= end; st = st + 1) {
    dVar11 = dVar11 + (w->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_start[ix_arr[st]];
  }
  dVar12 = 0.0;
  local_78 = 0.0;
LAB_0028f24a:
  puVar1 = (ulong *)(Xc_ind + lVar10);
  do {
    if (((puVar8 == puVar3) || (lVar10 == lVar5)) || (uVar7 = *puVar8, uVar6 < uVar7)) {
LAB_0028f365:
      if ((dVar12 == 0.0) && (!NAN(dVar12))) {
        return 0.0;
      }
      return (double)(~-(ulong)(dVar12 < dVar11) & (ulong)local_78 |
                     (ulong)((dVar12 / dVar11) * local_78) & -(ulong)(dVar12 < dVar11));
    }
    if (*puVar1 == uVar7) {
      dVar4 = (w->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start[uVar7];
      if ((uint)ABS(Xc[lVar10]) < 0x7f800000) {
        dVar12 = dVar12 + dVar4;
        local_78 = local_78 + (((double)Xc[lVar10] - local_78) * dVar4) / dVar12;
      }
      else {
        dVar11 = dVar11 - dVar4;
      }
      if ((puVar8 == ix_arr + end) || (lVar10 == lVar5 + -1)) goto LAB_0028f365;
      puVar8 = puVar8 + 1;
      plVar9 = std::__lower_bound<long*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                         (puVar1 + 1,puVar2 + 1,puVar8);
      lVar10 = (long)plVar9 - (long)Xc_ind >> 3;
      goto LAB_0028f24a;
    }
    if ((long)*puVar1 <= (long)uVar7) break;
    puVar8 = std::__lower_bound<unsigned_long*,long,__gnu_cxx::__ops::_Iter_less_val>
                       (puVar8 + 1,puVar3,puVar1);
  } while( true );
  plVar9 = std::__lower_bound<long*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                     (puVar1 + 1,puVar2 + 1,puVar8);
  lVar10 = (long)plVar9 - (long)Xc_ind >> 3;
  goto LAB_0028f24a;
}

Assistant:

double calc_mean_only_weighted(size_t *restrict ix_arr, size_t st, size_t end, size_t col_num,
                               real_t_ *restrict Xc, sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr,
                               mapping &restrict w)
{
    /* ix_arr must be already sorted beforehand */
    if (Xc_indptr[col_num] == Xc_indptr[col_num + 1])
        return 0;
    size_t st_col  = Xc_indptr[col_num];
    size_t end_col = Xc_indptr[col_num + 1] - 1;
    size_t curr_pos = st_col;
    size_t ind_end_col = (size_t) Xc_ind[end_col];
    size_t *ptr_st = std::lower_bound(ix_arr + st, ix_arr + end + 1, (size_t)Xc_ind[st_col]);

    ldouble_safe cnt = 0.;
    for (size_t row = st; row <= end; row++)
        cnt += w[ix_arr[row]];
    ldouble_safe added = 0;
    ldouble_safe m = 0;
    ldouble_safe w_this;

    for (size_t *row = ptr_st;
         row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
        )
    {
        if (Xc_ind[curr_pos] == (sparse_ix)(*row))
        {
            if (unlikely(is_na_or_inf(Xc[curr_pos]))) {
                cnt -= w[*row];
            }

            else {
                w_this = w[*row];
                added += w_this;
                m += w_this * (Xc[curr_pos] - m) / added;
            }

            if (row == ix_arr + end || curr_pos == end_col) break;
            curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
        }

        else
        {
            if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
            else
                curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
        }
    }

    if (added == 0)
        return 0;

    if (cnt > added)
        m *= (ldouble_safe)added / (ldouble_safe)cnt;

    return m;
}